

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

SchemaElementDecl * __thiscall
xercesc_4_0::TraverseSchema::processElementDeclRef
          (TraverseSchema *this,DOMElement *elem,XMLCh *refName)

{
  XSAnnotation *pXVar1;
  DOMElement *pDVar2;
  SchemaElementDecl *elem_00;
  
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,elem,0x11,this,false,this->fNonXSAttList);
  pDVar2 = XUtil::getFirstChildElement(&elem->super_DOMNode);
  pDVar2 = checkContent(this,elem,pDVar2,true,true);
  pXVar1 = this->fAnnotation;
  if (pDVar2 != (DOMElement *)0x0) {
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgValidityDomain,0x1f,
                      (XMLCh *)SchemaSymbols::fgELT_ELEMENT,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
  }
  elem_00 = getGlobalElemDecl(this,elem,refName);
  if (elem_00 == (SchemaElementDecl *)0x0) {
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x27,refName,(XMLCh *)0x0,
                      (XMLCh *)0x0,(XMLCh *)0x0);
  }
  else {
    if (this->fCurrentComplexType != (ComplexTypeInfo *)0x0) {
      ComplexTypeInfo::addElement(this->fCurrentComplexType,elem_00);
    }
    if (this->fCurrentGroupInfo != (XercesGroupInfo *)0x0) {
      XercesGroupInfo::addElement(this->fCurrentGroupInfo,elem_00);
    }
  }
  if (pXVar1 != (XSAnnotation *)0x0) {
    (*(pXVar1->super_XSerializable)._vptr_XSerializable[1])(pXVar1);
  }
  return elem_00;
}

Assistant:

SchemaElementDecl*
TraverseSchema::processElementDeclRef(const DOMElement* const elem,
                                      const XMLCh* const refName)
{
    // check attributes
    fAttributeCheck.checkAttributes(
        elem, GeneralAttributeCheck::E_ElementRef, this, false, fNonXSAttList
    );

    // handle annotation
    DOMElement* content = checkContent(elem, XUtil::getFirstChildElement(elem), true);
    Janitor<XSAnnotation> janAnnot(fAnnotation);

    // do not generate synthetic annotation for element reference...

    if (content != 0)
        reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::NoContentForRef, SchemaSymbols::fgELT_ELEMENT);

    SchemaElementDecl* refElemDecl = getGlobalElemDecl(elem, refName);

    if (!refElemDecl)
    {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::RefElementNotFound, refName);
    }
    else
    {
        if (fCurrentComplexType)
            fCurrentComplexType->addElement(refElemDecl);

        if (fCurrentGroupInfo)
            fCurrentGroupInfo->addElement(refElemDecl);
    }

    return refElemDecl;
}